

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_request.c
# Opt level: O1

tnt_request * tnt_request_init(tnt_request *req)

{
  bool bVar1;
  
  bVar1 = req == (tnt_request *)0x0;
  if ((bVar1) && (req = (tnt_request *)tnt_mem_alloc(0x60), req == (tnt_request *)0x0)) {
    return (tnt_request *)0x0;
  }
  req->space_id = 0;
  req->index_id = 0;
  req->offset = 0;
  req->limit = 0;
  req->tuple_object = (tnt_stream *)0x0;
  req->index_base = 0;
  req->alloc = 0;
  req->tuple = (char *)0x0;
  req->tuple_end = (char *)0x0;
  req->key_end = (char *)0x0;
  req->key_object = (tnt_stream *)0x0;
  *(undefined8 *)&req->iterator = 0;
  req->key = (char *)0x0;
  (req->hdr).sync = 0;
  *(undefined8 *)&(req->hdr).type = 0;
  req->limit = 0xffffffff;
  req->alloc = (uint)bVar1;
  return req;
}

Assistant:

struct tnt_request *tnt_request_init(struct tnt_request *req) {
	int alloc = (req == NULL);
	if (req == NULL) {
		req = tnt_mem_alloc(sizeof(struct tnt_request));
		if (!req) return NULL;
	}
	memset(req, 0, sizeof(struct tnt_request));
	req->limit = UINT32_MAX;
	req->alloc = alloc;
	return req;
}